

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.c
# Opt level: O0

void end_dump(int how,char *killbuf,char *pbuf,long umoney)

{
  int iVar1;
  int local_2c;
  int line;
  int i;
  long umoney_local;
  char *pbuf_local;
  char *killbuf_local;
  int how_local;
  
  if (dumpfp != (FILE *)0x0) {
    fprintf((FILE *)dumpfp,"Latest messages:\n");
    for (local_2c = 0; local_2c < 0x1e; local_2c = local_2c + 1) {
      iVar1 = (curline + local_2c) % 0x1e;
      if (toplines[iVar1][0] != '\0') {
        if (toplines_count[iVar1] == 1) {
          fprintf((FILE *)dumpfp,"  %s\n",toplines + iVar1);
        }
        else {
          fprintf((FILE *)dumpfp,"  %s (%dx)\n",toplines + iVar1,(ulong)(uint)toplines_count[iVar1])
          ;
        }
      }
    }
    fprintf((FILE *)dumpfp,"\n");
    dump_catch_menus('\x01');
    display_rip(how,killbuf,pbuf,umoney);
    dump_catch_menus('\0');
    fclose((FILE *)dumpfp);
  }
  return;
}

Assistant:

void end_dump(int how, char *killbuf, char *pbuf, long umoney)
{
    int i, line;
    if (!dumpfp)
	return;
    
    fprintf(dumpfp, "Latest messages:\n");
    for (i = 0; i < MSGCOUNT; i++) {
	line = (curline + i) % MSGCOUNT;
	if (toplines[line][0]) {
	    if (toplines_count[line] == 1) {
		fprintf(dumpfp, "  %s\n", toplines[line]);
	    } else {
		fprintf(dumpfp, "  %s (%dx)\n", toplines[line],
			toplines_count[line]);
	    }
	}
    }
    fprintf(dumpfp, "\n");
    
    dump_catch_menus(TRUE);
    display_rip(how, killbuf, pbuf, umoney);
    dump_catch_menus(FALSE);
    
    fclose(dumpfp);
}